

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearTests.cpp
# Opt level: O0

void deqp::egl::createColorClearGroups<deqp::egl::SingleThreadColorClearCase>
               (EglTestContext *eglTestCtx,TestCaseGroup *group,ColorClearGroupSpec *first,
               ColorClearGroupSpec *last)

{
  EGLint api;
  bool bVar1;
  EGLint surfaceType;
  TestNode *node;
  TestContext *testCtx;
  TestNode *node_00;
  pointer pRVar2;
  char *name;
  reference filters;
  __normal_iterator<deqp::egl::RenderFilterList_*,_std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>_>
  local_90;
  __normal_iterator<deqp::egl::RenderFilterList_*,_std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>_>
  local_88;
  __normal_iterator<const_deqp::egl::RenderFilterList_*,_std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>_>
  local_80;
  const_iterator listIter;
  FilterList baseFilters;
  vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_> filterLists;
  TestCaseGroup *configGroup;
  ColorClearGroupSpec *groupIter;
  ColorClearGroupSpec *last_local;
  ColorClearGroupSpec *first_local;
  TestCaseGroup *group_local;
  EglTestContext *eglTestCtx_local;
  
  for (configGroup = (TestCaseGroup *)first; (ColorClearGroupSpec *)configGroup != last;
      configGroup = (TestCaseGroup *)((long)&(configGroup->super_TestNode).m_name.field_2 + 8)) {
    node = (TestNode *)operator_new(0x70);
    testCtx = EglTestContext::getTestContext(eglTestCtx);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,testCtx,(char *)(configGroup->super_TestNode)._vptr_TestNode,
               (char *)(configGroup->super_TestNode).m_testCtx);
    tcu::TestNode::addChild(&group->super_TestNode,node);
    std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>::vector
              ((vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_> *)
               &baseFilters.m_rules.
                super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    eglu::FilterList::FilterList((FilterList *)&listIter);
    eglu::FilterList::operator<<
              ((FilterList *)&listIter,
               (ConfigFilter)(configGroup->super_TestNode).m_name._M_string_length);
    getDefaultRenderFilterLists
              ((vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_> *)
               &baseFilters.m_rules.
                super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(FilterList *)&listIter);
    local_88._M_current =
         (RenderFilterList *)
         std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>::
         begin((vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_> *)
               &baseFilters.m_rules.
                super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<deqp::egl::RenderFilterList_const*,std::vector<deqp::egl::RenderFilterList,std::allocator<deqp::egl::RenderFilterList>>>
    ::__normal_iterator<deqp::egl::RenderFilterList*>
              ((__normal_iterator<deqp::egl::RenderFilterList_const*,std::vector<deqp::egl::RenderFilterList,std::allocator<deqp::egl::RenderFilterList>>>
                *)&local_80,&local_88);
    while( true ) {
      local_90._M_current =
           (RenderFilterList *)
           std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>::
           end((vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_> *)
               &baseFilters.m_rules.
                super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = __gnu_cxx::operator!=(&local_80,&local_90);
      if (!bVar1) break;
      node_00 = (TestNode *)operator_new(200);
      pRVar2 = __gnu_cxx::
               __normal_iterator<const_deqp::egl::RenderFilterList_*,_std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>_>
               ::operator->(&local_80);
      name = NamedFilterList::getName(&pRVar2->super_NamedFilterList);
      api = *(EGLint *)&(configGroup->super_TestNode).m_name;
      pRVar2 = __gnu_cxx::
               __normal_iterator<const_deqp::egl::RenderFilterList_*,_std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>_>
               ::operator->(&local_80);
      surfaceType = RenderFilterList::getSurfaceTypeMask(pRVar2);
      filters = __gnu_cxx::
                __normal_iterator<const_deqp::egl::RenderFilterList_*,_std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>_>
                ::operator*(&local_80);
      SingleThreadColorClearCase::SingleThreadColorClearCase
                ((SingleThreadColorClearCase *)node_00,eglTestCtx,name,"",api,surfaceType,
                 (FilterList *)filters,*(int *)&(configGroup->super_TestNode).m_name.field_2);
      tcu::TestNode::addChild(node,node_00);
      __gnu_cxx::
      __normal_iterator<const_deqp::egl::RenderFilterList_*,_std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>_>
      ::operator++(&local_80,0);
    }
    eglu::FilterList::~FilterList((FilterList *)&listIter);
    std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>::~vector
              ((vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_> *)
               &baseFilters.m_rules.
                super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

static void createColorClearGroups (EglTestContext& eglTestCtx, tcu::TestCaseGroup* group, const ColorClearGroupSpec* first, const ColorClearGroupSpec* last)
{
	for (const ColorClearGroupSpec* groupIter = first; groupIter != last; groupIter++)
	{
		tcu::TestCaseGroup* configGroup = new tcu::TestCaseGroup(eglTestCtx.getTestContext(), groupIter->name, groupIter->desc);
		group->addChild(configGroup);

		vector<RenderFilterList>	filterLists;
		eglu::FilterList			baseFilters;
		baseFilters << groupIter->baseFilter;
		getDefaultRenderFilterLists(filterLists, baseFilters);

		for (vector<RenderFilterList>::const_iterator listIter = filterLists.begin(); listIter != filterLists.end(); listIter++)
			configGroup->addChild(new ClearClass(eglTestCtx, listIter->getName(), "", groupIter->apiBits, listIter->getSurfaceTypeMask(), *listIter, groupIter->numContextsPerApi));
	}
}